

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_java_struct_tuple_writer
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  uint uVar1;
  int *piVar2;
  e_req eVar3;
  t_field *ptVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  bool bVar8;
  pointer pptVar9;
  int iVar10;
  string local_98;
  ostream *local_78;
  string local_70;
  string local_50;
  
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"@Override",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"public void write(org.apache.thrift.protocol.TProtocol prot, ",0x3d);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,*(char **)CONCAT44(extraout_var,iVar5),
                      ((undefined8 *)CONCAT44(extraout_var,iVar5))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," struct) throws org.apache.thrift.TException {",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  local_78 = out;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "org.apache.thrift.protocol.TTupleProtocol oprot = (org.apache.thrift.protocol.TTupleProtocol) prot;"
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar9 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar9 ==
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    bVar8 = false;
  }
  else {
    bVar8 = false;
    iVar5 = 0;
    do {
      ptVar4 = *pptVar9;
      eVar3 = ptVar4->req_;
      uVar1 = eVar3 - T_OPTIONAL;
      iVar5 = iVar5 + (uint)(uVar1 < 2);
      if (uVar1 < 2) {
        bVar8 = true;
      }
      if (eVar3 == T_REQUIRED) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"struct.","");
        generate_serialize_field(this,local_78,ptVar4,&local_50,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar6 = local_78;
  if (bVar8) {
    poVar7 = t_generator::indent((t_generator *)this,local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"java.util.BitSet optionals = new java.util.BitSet();",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar9 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar10 = 0;
      do {
        if ((*pptVar9)->req_ - T_OPTIONAL < 2) {
          poVar7 = t_generator::indent((t_generator *)this,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (struct.",0xb);
          generate_isset_check_abi_cxx11_(&local_98,this,*pptVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_98._M_dataplus._M_p,local_98._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") {",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar2 = *piVar2 + 1;
          poVar7 = t_generator::indent((t_generator *)this,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"optionals.set(",0xe);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar2 = *piVar2 + -1;
          poVar7 = t_generator::indent((t_generator *)this,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          iVar10 = iVar10 + 1;
        }
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    poVar7 = t_generator::indent((t_generator *)this,poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeBitSet(optionals, ",0x1d);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar9 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if ((*pptVar9)->req_ - T_OPTIONAL < 2) {
          poVar7 = t_generator::indent((t_generator *)this,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (struct.",0xb);
          generate_isset_check_abi_cxx11_(&local_98,this,*pptVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_98._M_dataplus._M_p,local_98._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") {",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar2 = *piVar2 + 1;
          ptVar4 = *pptVar9;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"struct.","");
          generate_serialize_field(this,poVar6,ptVar4,&local_70,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar2 = *piVar2 + -1;
          poVar7 = t_generator::indent((t_generator *)this,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar6 = t_generator::indent((t_generator *)this,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_writer(ostream& out, t_struct* tstruct) {
  indent(out) << "@Override" << endl;
  indent(out) << "public void write(org.apache.thrift.protocol.TProtocol prot, "
              << tstruct->get_name() << " struct) throws org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "org.apache.thrift.protocol.TTupleProtocol oprot = (org.apache.thrift.protocol.TTupleProtocol) prot;" << endl;

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool has_optional = false;
  int optional_count = 0;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_OPTIONAL
        || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
      optional_count++;
      has_optional = true;
    }
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      generate_serialize_field(out, (*f_iter), "struct.", false);
    }
  }
  if (has_optional) {
    indent(out) << "java.util.BitSet optionals = new java.util.BitSet();" << endl;
    int i = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (struct." << generate_isset_check((*f_iter)) << ") {" << endl;
        indent_up();
        indent(out) << "optionals.set(" << i << ");" << endl;
        indent_down();
        indent(out) << "}" << endl;
        i++;
      }
    }

    indent(out) << "oprot.writeBitSet(optionals, " << optional_count << ");" << endl;
    int j = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (struct." << generate_isset_check(*f_iter) << ") {" << endl;
        indent_up();
        generate_serialize_field(out, (*f_iter), "struct.", false);
        indent_down();
        indent(out) << "}" << endl;
        j++;
      }
    }
  }
  indent_down();
  indent(out) << "}" << endl;
}